

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_document::document_element(xml_document *this)

{
  xml_node_struct *p;
  xml_node_struct *in_RAX;
  xml_node_struct **ppxVar1;
  xml_node local_8;
  
  ppxVar1 = &((this->super_xml_node)._root)->first_child;
  while( true ) {
    p = *ppxVar1;
    local_8._root = in_RAX;
    if (p == (xml_node_struct *)0x0) {
      xml_node::xml_node(&local_8);
      return (xml_node)local_8._root;
    }
    if ((p->header & 0xf) == 2) break;
    ppxVar1 = &p->next_sibling;
  }
  xml_node::xml_node(&local_8,p);
  return (xml_node)local_8._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_document::document_element() const
	{
		assert(_root);

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (PUGI_IMPL_NODETYPE(i) == node_element)
				return xml_node(i);

		return xml_node();
	}